

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

VkBufferImageCopy *
vkt::tessellation::makeBufferImageCopy
          (VkBufferImageCopy *__return_storage_ptr__,VkExtent3D extent,
          VkImageSubresourceLayers subresourceLayers)

{
  VkOffset3D VVar1;
  VkBufferImageCopy *copyParams;
  undefined8 local_48;
  deInt32 local_40;
  VkImageSubresourceLayers subresourceLayers_local;
  VkExtent3D extent_local;
  
  __return_storage_ptr__->bufferOffset = 0;
  __return_storage_ptr__->bufferRowLength = 0;
  __return_storage_ptr__->bufferImageHeight = 0;
  (__return_storage_ptr__->imageSubresource).aspectMask = (int)subresourceLayers._0_8_;
  (__return_storage_ptr__->imageSubresource).mipLevel =
       (int)((ulong)subresourceLayers._0_8_ >> 0x20);
  (__return_storage_ptr__->imageSubresource).baseArrayLayer = (int)subresourceLayers._8_8_;
  (__return_storage_ptr__->imageSubresource).layerCount =
       (int)((ulong)subresourceLayers._8_8_ >> 0x20);
  VVar1 = ::vk::makeOffset3D(0,0,0);
  local_48 = VVar1._0_8_;
  (__return_storage_ptr__->imageOffset).x = (undefined4)local_48;
  (__return_storage_ptr__->imageOffset).y = local_48._4_4_;
  local_40 = VVar1.z;
  (__return_storage_ptr__->imageOffset).z = local_40;
  (__return_storage_ptr__->imageExtent).width = (int)extent._0_8_;
  (__return_storage_ptr__->imageExtent).height = (int)((ulong)extent._0_8_ >> 0x20);
  (__return_storage_ptr__->imageExtent).depth = extent.depth;
  return __return_storage_ptr__;
}

Assistant:

VkBufferImageCopy makeBufferImageCopy (const VkExtent3D					extent,
									   const VkImageSubresourceLayers	subresourceLayers)
{
	const VkBufferImageCopy copyParams =
	{
		0ull,										//	VkDeviceSize				bufferOffset;
		0u,											//	deUint32					bufferRowLength;
		0u,											//	deUint32					bufferImageHeight;
		subresourceLayers,							//	VkImageSubresourceLayers	imageSubresource;
		makeOffset3D(0, 0, 0),						//	VkOffset3D					imageOffset;
		extent,										//	VkExtent3D					imageExtent;
	};
	return copyParams;
}